

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

VdbeOp * sqlite3VdbeAddOpList(Vdbe *p,int nOp,VdbeOpList *aOp,int iLineno)

{
  byte bVar1;
  char cVar2;
  Op *pOVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  VdbeOp *pVVar7;
  
  iVar4 = p->nOp;
  if (p->nOpAlloc < iVar4 + nOp) {
    iVar4 = growOpArray(p,nOp);
    if (iVar4 != 0) {
      return (VdbeOp *)0x0;
    }
    iVar4 = p->nOp;
  }
  lVar5 = (long)iVar4;
  pOVar3 = p->aOp;
  if (0 < nOp) {
    lVar6 = 0;
    pVVar7 = pOVar3 + lVar5;
    do {
      bVar1 = aOp[lVar6].opcode;
      pVVar7->opcode = bVar1;
      pVVar7->p1 = (int)aOp[lVar6].p1;
      cVar2 = aOp[lVar6].p2;
      pVVar7->p2 = (int)cVar2;
      if (((""[bVar1] & 1) != 0) && ('\0' < cVar2)) {
        pVVar7->p2 = (int)cVar2 + p->nOp;
      }
      pVVar7->p3 = (int)aOp[lVar6].p3;
      pVVar7->p4type = '\0';
      (pVVar7->p4).p = (void *)0x0;
      pVVar7->p5 = 0;
      pVVar7 = pVVar7 + 1;
      lVar6 = lVar6 + 1;
    } while (nOp != (int)lVar6);
    iVar4 = p->nOp;
  }
  p->nOp = iVar4 + nOp;
  return pOVar3 + lVar5;
}

Assistant:

SQLITE_PRIVATE VdbeOp *sqlite3VdbeAddOpList(
  Vdbe *p,                     /* Add opcodes to the prepared statement */
  int nOp,                     /* Number of opcodes to add */
  VdbeOpList const *aOp,       /* The opcodes to be added */
  int iLineno                  /* Source-file line number of first opcode */
){
  int i;
  VdbeOp *pOut, *pFirst;
  assert( nOp>0 );
  assert( p->eVdbeState==VDBE_INIT_STATE );
  if( p->nOp + nOp > p->nOpAlloc && growOpArray(p, nOp) ){
    return 0;
  }
  pFirst = pOut = &p->aOp[p->nOp];
  for(i=0; i<nOp; i++, aOp++, pOut++){
    pOut->opcode = aOp->opcode;
    pOut->p1 = aOp->p1;
    pOut->p2 = aOp->p2;
    assert( aOp->p2>=0 );
    if( (sqlite3OpcodeProperty[aOp->opcode] & OPFLG_JUMP)!=0 && aOp->p2>0 ){
      pOut->p2 += p->nOp;
    }
    pOut->p3 = aOp->p3;
    pOut->p4type = P4_NOTUSED;
    pOut->p4.p = 0;
    pOut->p5 = 0;
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
    pOut->zComment = 0;
#endif
#ifdef SQLITE_VDBE_COVERAGE
    pOut->iSrcLine = iLineno+i;
#else
    (void)iLineno;
#endif
#ifdef SQLITE_DEBUG
    if( p->db->flags & SQLITE_VdbeAddopTrace ){
      sqlite3VdbePrintOp(0, i+p->nOp, &p->aOp[i+p->nOp]);
    }
#endif
  }
  p->nOp += nOp;
  return pFirst;
}